

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_paths.cpp
# Opt level: O2

void __thiscall ExchangePaths_ImportEmpty_Test::TestBody(ExchangePaths_ImportEmpty_Test *this)

{
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  char *message;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_210;
  mock_mutex mutex;
  AssertHelper local_200;
  string local_1f8;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> exported_paths;
  not_null<transaction_base_*> local_198;
  coord local_190;
  AssertionResult gtest_ar_;
  parser<pstore::exchange::import_ns::callbacks> name_parser;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  string_mapping imported_paths;
  
  s_abi_cxx11_(&exported_paths,"[]\n",3);
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&name_parser,&mutex);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,&(this->super_ExchangePaths).import_db_,(lock_type *)&name_parser);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&name_parser);
  imported_paths.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_paths.strings_;
  imported_paths.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imported_paths.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imported_paths.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imported_paths.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_paths.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_paths.views_;
  imported_paths.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_paths.lookup_._M_h._M_buckets = &imported_paths.lookup_._M_h._M_single_bucket;
  imported_paths.lookup_._M_h._M_bucket_count = 1;
  imported_paths.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  imported_paths.lookup_._M_h._M_element_count = 0;
  imported_paths.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  imported_paths.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  imported_paths.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  imported_paths.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_paths.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  imported_paths.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_paths.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  anon_unknown.dwarf_3015a9::import_strings_parser(&name_parser,&transaction,&imported_paths);
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                      (&name_parser,&exported_paths);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = name_parser.error_._M_value == 0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&name_parser);
    local_198.ptr_ = &transaction.super_transaction_base;
    pstore::gsl::not_null<pstore::transaction_base_*>::ensure_invariant(&local_198);
    pstore::exchange::import_ns::string_mapping::flush(&imported_paths,local_198);
    pstore::transaction_base::commit(&transaction.super_transaction_base);
    pstore::exchange::import_ns::string_mapping::lookup
              ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&name_parser,
               &imported_paths,0);
    local_1f8._M_dataplus._M_p._0_4_ = 4;
    testing::internal::
    CmpHelperEQ<pstore::error_or<pstore::typed_address<pstore::indirect_string>>,pstore::exchange::import_ns::error>
              ((internal *)&gtest_ar,"imported_paths.lookup (0U)",
               "pstore::exchange::import_ns::error::no_such_name",
               (error_or<pstore::typed_address<pstore::indirect_string>_> *)&name_parser,
               (error *)&local_1f8);
    pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::~error_or
              ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&name_parser);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&name_parser);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                 ,0x72,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)&name_parser)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
      if ((__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
           )name_parser.singletons_._M_t.
            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
            .
            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
           )0x0) {
        (**(code **)(*(long *)name_parser.singletons_._M_t.
                              super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                              .
                              super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                              ._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  else {
    testing::Message::Message((Message *)&local_210);
    std::operator<<((ostream *)(local_210._M_head_impl + 0x10),"JSON error was: ");
    (**(code **)(*(long *)name_parser.error_._M_cat + 0x20))
              (&gtest_ar,name_parser.error_._M_cat,name_parser.error_._M_value);
    std::operator<<((ostream *)(local_210._M_head_impl + 0x10),(string *)&gtest_ar);
    std::operator<<((ostream *)(local_210._M_head_impl + 0x10),' ');
    local_190 = name_parser.coordinate_;
    pstore::json::operator<<((ostream *)(local_210._M_head_impl + 0x10),&local_190);
    std::operator<<((ostream *)(local_210._M_head_impl + 0x10),'\n');
    std::operator<<((ostream *)(local_210._M_head_impl + 0x10),(string *)&exported_paths);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f8,(internal *)&gtest_ar_,(AssertionResult *)"name_parser.has_error ()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
               ,0x69,(char *)CONCAT44(local_1f8._M_dataplus._M_p._4_4_,
                                      local_1f8._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_210._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_210._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&name_parser);
  }
  pstore::exchange::import_ns::string_mapping::~string_mapping(&imported_paths);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&transaction);
  std::__cxx11::string::~string((string *)&exported_paths);
  return;
}

Assistant:

TEST_F (ExchangePaths, ImportEmpty) {
    auto const exported_paths = "[]\n"s;

    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});

    pstore::exchange::import_ns::string_mapping imported_paths;
    {
        auto name_parser = import_strings_parser (&transaction, &imported_paths);
        name_parser.input (exported_paths).eof ();
        ASSERT_FALSE (name_parser.has_error ())
            << "JSON error was: " << name_parser.last_error ().message () << ' '
            << name_parser.coordinate () << '\n'
            << exported_paths;
    }

    imported_paths.flush (&transaction);
    transaction.commit ();

    EXPECT_EQ (imported_paths.lookup (0U), pstore::exchange::import_ns::error::no_such_name);
}